

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type
time_plain<std::subtract_with_carry_engine<unsigned_long,24ul,10ul,24ul>>
          (subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL> *r)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  result_type rVar6;
  long lVar7;
  ulong uVar8;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar3 = r->_M_p;
  lVar2 = 0x1000000;
  rVar6 = 0;
  do {
    lVar7 = uVar3 + 0xe;
    if (-1 < (long)(uVar3 - 10)) {
      lVar7 = uVar3 - 10;
    }
    uVar4 = r->_M_carry + r->_M_x[uVar3];
    uVar5 = r->_M_x[lVar7];
    uVar8 = uVar5 + 0x1000000;
    if (uVar5 >= uVar4) {
      uVar8 = uVar5;
    }
    r->_M_carry = (ulong)(uVar5 < uVar4);
    r->_M_x[uVar3] = uVar8 - uVar4;
    uVar5 = r->_M_p + 1;
    uVar3 = 0;
    if (uVar5 < 0x18) {
      uVar3 = uVar5;
    }
    r->_M_p = uVar3;
    rVar6 = rVar6 + (uVar8 - uVar4);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar2 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar6;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}